

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O1

void __thiscall
GslSpan_FromPointerLengthConstructor_Test::~GslSpan_FromPointerLengthConstructor_Test
          (GslSpan_FromPointerLengthConstructor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (GslSpan, FromPointerLengthConstructor) {
    int arr[4] = {1, 2, 3, 4};

    {
        span<int> s{&arr[0], 2};
        EXPECT_EQ (s.length (), 2);
        EXPECT_EQ (s.data (), &arr[0]);
        EXPECT_EQ (s[0], 1);
        EXPECT_EQ (s[1], 2);
    }
    {
        span<int, 2> s{&arr[0], 2};
        EXPECT_EQ (s.length (), 2);
        EXPECT_EQ (s.data (), &arr[0]);
        EXPECT_EQ (s[0], 1);
        EXPECT_EQ (s[1], 2);
    }
    {
        int * p = nullptr;
        span<int> s{p, static_cast<span<int>::index_type> (0)};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);
    }
    {
        auto s = make_span (&arr[0], 2);
        EXPECT_EQ (s.length (), 2);
        EXPECT_EQ (s.data (), &arr[0]);
        EXPECT_EQ (s[0], 1);
        EXPECT_EQ (s[1], 2);
    }
    {
        int * p = nullptr;
        auto s = make_span (p, static_cast<span<int>::index_type> (0));
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);
    }
}